

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O3

aspa_status
aspa_table_update_swap_in_compute
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update **update)

{
  aspa_update_operation *paVar1;
  aspa_array *paVar2;
  size_t __nmemb;
  uint32_t *__base;
  aspa_array *array;
  aspa_status aVar3;
  aspa_update *paVar4;
  aspa_store_node *paVar5;
  aspa_store_node *paVar6;
  aspa_update_operation *paVar7;
  aspa_record *paVar8;
  aspa_record *paVar9;
  aspa_update_operation *paVar10;
  aspa_store_node **ppaVar11;
  aspa_status aVar12;
  ulong uVar13;
  ulong uVar14;
  ulong index;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  aspa_array *new_array;
  aspa_array *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a5,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a6,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (update == (aspa_update **)0x0) {
    __assert_fail("update",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a7,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    aVar12 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
    goto LAB_0010cfb7;
  }
  if (*update == (aspa_update *)0x0) {
    paVar4 = (aspa_update *)lrtr_malloc(0x30);
    *update = paVar4;
    if (paVar4 != (aspa_update *)0x0) goto LAB_0010cc29;
  }
  else {
LAB_0010cc29:
    pthread_rwlock_wrlock((pthread_rwlock_t *)&aspa_table->update_lock);
    (*update)->table = aspa_table;
    (*update)->operations = operations;
    paVar4 = *update;
    paVar4->operation_count = count;
    paVar4->failed_operation = (aspa_update_operation *)0x0;
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    paVar6 = aspa_table->store;
    if (paVar6 != (aspa_store_node *)0x0) {
      ppaVar11 = &aspa_table->store;
      if (paVar6->rtr_socket != rtr_socket) {
        do {
          paVar5 = paVar6;
          paVar6 = paVar5->next;
          if (paVar6 == (aspa_store_node *)0x0) goto LAB_0010ccb3;
        } while (paVar6->rtr_socket != rtr_socket);
        ppaVar11 = &paVar5->next;
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      paVar6 = *ppaVar11;
      if (paVar6 == (aspa_store_node *)0x0) goto LAB_0010ccbb;
LAB_0010cd25:
      if (paVar6->aspa_array == (aspa_array *)0x0) {
        __assert_fail("(*node)->aspa_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x1dd,
                      "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                     );
      }
      local_40 = (aspa_array *)0x0;
      aVar3 = aspa_array_create(&local_40);
      aVar12 = ASPA_ERROR;
      if (aVar3 == ASPA_SUCCESS) {
        pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
        array = local_40;
        paVar2 = (*ppaVar11)->aspa_array;
        if (paVar2 == (aspa_array *)0x0) {
          __assert_fail("array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x11c,
                        "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        if (operations == (aspa_update_operation *)0x0) {
          __assert_fail("operations",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x11d,
                        "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        paVar4 = *update;
        aspa_array_reserve(local_40,paVar2->size + count);
        index = 0;
        uVar13 = 0;
        do {
          paVar1 = operations + uVar13 + 1;
          paVar10 = (aspa_update_operation *)0x0;
          if (uVar13 < count - 1) {
            paVar10 = paVar1;
          }
          paVar7 = operations + uVar13;
          __nmemb = paVar1[-1].record.provider_count;
          if (paVar1[-1].type == ASPA_REMOVE) {
            if (__nmemb != 0) {
              __assert_fail("current->record.provider_count == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x12d,
                            "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
            if ((paVar7->record).provider_asns != (uint32_t *)0x0) {
              __assert_fail("!current->record.provider_asns",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x12e,
                            "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
          }
          else if ((__nmemb != 0) &&
                  (__base = (paVar7->record).provider_asns, __base != (uint32_t *)0x0)) {
            qsort(__base,__nmemb,4,compare_asns);
          }
          uVar14 = uVar13 + 1;
          paVar9 = &paVar7->record;
          while ((index < paVar2->size &&
                 (paVar8 = aspa_array_get_record(paVar2,index),
                 paVar8->customer_asn < paVar9->customer_asn))) {
            index = index + 1;
            aVar12 = aspa_array_append(array,paVar8,false);
            if (aVar12 != ASPA_SUCCESS) goto LAB_0010cf7b;
          }
          paVar8 = aspa_array_get_record(paVar2,index);
          if (paVar8 == (aspa_record *)0x0) {
            bVar15 = false;
          }
          else {
            bVar15 = paVar8->customer_asn == paVar9->customer_asn;
          }
          if (uVar13 < count - 1) {
            bVar16 = (paVar1->record).customer_asn == paVar9->customer_asn;
          }
          else {
            bVar16 = false;
          }
          if (paVar7->type == ASPA_REMOVE) {
            if (bVar15) {
              if ((!bVar16) || (paVar10->type != ASPA_REMOVE)) {
                index = index + 1;
                (paVar7->record).provider_count = paVar8->provider_count;
                (paVar7->record).provider_asns = paVar8->provider_asns;
                goto LAB_0010cf51;
              }
              paVar4->failed_operation = paVar10;
            }
            else {
              paVar4->failed_operation = paVar7;
            }
            aVar12 = ASPA_RECORD_NOT_FOUND;
LAB_0010cf8e:
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            (*update)->node = (aspa_store_node *)0x0;
            (*update)->new_array = (aspa_array *)0x0;
            aspa_array_free(local_40,false);
            goto LAB_0010cfb7;
          }
          if (paVar7->type == ASPA_ADD) {
            if (bVar15) {
              paVar4->failed_operation = paVar7;
LAB_0010d049:
              aVar12 = ASPA_DUPLICATE_RECORD;
            }
            else {
              if (bVar16) {
                if (paVar10->type == ASPA_REMOVE) {
                  paVar7->is_no_op = true;
                  paVar10->is_no_op = true;
                  uVar14 = uVar13 + 2;
                  goto LAB_0010cf51;
                }
                if (paVar10->type == ASPA_ADD) {
                  paVar4->failed_operation = paVar10;
                  (paVar7->record).provider_asns = (uint32_t *)0x0;
                  goto LAB_0010d049;
                }
              }
              aVar12 = aspa_array_append(array,paVar9,true);
              if (aVar12 == ASPA_SUCCESS) {
                paVar9 = aspa_array_get_record(array,(ulong)(array->size - 1));
                (paVar7->record).provider_asns = paVar9->provider_asns;
                goto LAB_0010cf51;
              }
LAB_0010cf7b:
              paVar4->failed_operation = paVar7;
              aVar12 = ASPA_ERROR;
            }
            goto LAB_0010cf8e;
          }
LAB_0010cf51:
          uVar13 = uVar14;
        } while (uVar14 < count);
        for (; index < paVar2->size; index = index + 1) {
          paVar9 = aspa_array_get_record(paVar2,index);
          aspa_array_append(array,paVar9,false);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        (*update)->node = *ppaVar11;
        (*update)->new_array = local_40;
        aVar12 = ASPA_SUCCESS;
      }
      goto LAB_0010cfb7;
    }
LAB_0010ccb3:
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
LAB_0010ccbb:
    local_40 = (aspa_array *)0x0;
    aVar12 = aspa_array_create(&local_40);
    if (aVar12 == ASPA_SUCCESS) {
      pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
      paVar2 = local_40;
      paVar6 = (aspa_store_node *)lrtr_malloc(0x18);
      if (paVar6 != (aspa_store_node *)0x0) {
        paVar6->rtr_socket = rtr_socket;
        paVar6->aspa_array = paVar2;
        paVar6->next = aspa_table->store;
        aspa_table->store = paVar6;
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        paVar6 = aspa_table->store;
        ppaVar11 = &aspa_table->store;
        if (paVar6 == (aspa_store_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x1dc,
                        "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                       );
        }
        goto LAB_0010cd25;
      }
      aspa_array_free(local_40,false);
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    }
  }
  aVar12 = ASPA_ERROR;
LAB_0010cfb7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return aVar12;
}

Assistant:

enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						   struct aspa_update_operation *operations, size_t count,
						   struct aspa_update **update)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(update);

	if (!aspa_table || !rtr_socket || !update || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	if (!*update) {
		*update = lrtr_malloc(sizeof(struct aspa_update));

		if (!*update)
			return ASPA_ERROR;
	}

	// MARK: Update Lock
	// Prevent interim writes to the table: We need to make sure the table stays the same
	// until the cleanup since the computed update is based on the state the table is in right now
	pthread_rwlock_wrlock(&aspa_table->update_lock);

	(*update)->table = aspa_table;
	(*update)->operations = operations;
	(*update)->operation_count = count;
	(*update)->failed_operation = NULL;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_rdlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	pthread_rwlock_unlock(&aspa_table->lock);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		pthread_rwlock_wrlock(&aspa_table->lock);
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
		pthread_rwlock_unlock(&aspa_table->lock);
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	// Create new array that will hold updated record data
	struct aspa_array *new_array = NULL;

	if (aspa_array_create(&new_array) != ASPA_SUCCESS)
		return ASPA_ERROR;

	// Populate new_array
	pthread_rwlock_rdlock(&aspa_table->lock);
	enum aspa_status res = aspa_table_update_compute_internal(rtr_socket, (*node)->aspa_array, new_array,
								  operations, count, &(*update)->failed_operation);
	pthread_rwlock_unlock(&aspa_table->lock);

	if (res == ASPA_SUCCESS) {
		(*update)->node = *node;
		(*update)->new_array = new_array;
	} else {
		(*update)->node = NULL;
		(*update)->new_array = NULL;

		// Update computation failed so release newly created array.
		// We must not release associated provider arrays here.
		aspa_array_free(new_array, false);
	}
	return res;
}